

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::LocalDeclStatement(SQCompiler *this)

{
  SQLexer *this_00;
  SQInteger SVar1;
  SQInteger SVar2;
  SQFuncState *pSVar3;
  SQObject SVar4;
  SQInstruction local_40;
  SQObject local_38;
  
  this_00 = &this->_lex;
  SVar1 = SQLexer::Lex(this_00);
  this->_token = SVar1;
  if (SVar1 == 0x11d) {
    SVar1 = SQLexer::Lex(this_00);
    this->_token = SVar1;
    SVar4 = Expect(this,0x102);
    local_38._unVal = SVar4._unVal;
    local_38._type = SVar4._type;
    Expect(this,0x28);
    CreateFunction(this,&local_38,false);
    pSVar3 = this->_fs;
    SVar1 = SQFuncState::PushTarget(pSVar3,-1);
    local_40.op = '0';
    local_40._arg0 = (uchar)SVar1;
    local_40._arg1 = (int)(this->_fs->_functions)._size + -1;
    local_40._arg2 = '\0';
    local_40._arg3 = '\0';
    SQFuncState::AddInstruction(pSVar3,&local_40);
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PushLocalVariable(this->_fs,&local_38);
    return;
  }
  do {
    SVar4 = Expect(this,0x102);
    local_38._unVal = SVar4._unVal;
    local_38._type = SVar4._type;
    if (this->_token == 0x3d) {
      SVar1 = SQLexer::Lex(this_00);
      this->_token = SVar1;
      Expression(this);
      SVar1 = SQFuncState::PopTarget(this->_fs);
      SVar2 = SQFuncState::PushTarget(this->_fs,-1);
      if (SVar2 != SVar1) {
        pSVar3 = this->_fs;
        local_40.op = '\n';
        local_40._arg0 = (uchar)SVar2;
        local_40._arg1 = (SQInt32)SVar1;
        goto LAB_001104bc;
      }
    }
    else {
      pSVar3 = this->_fs;
      SVar1 = SQFuncState::PushTarget(pSVar3,-1);
      local_40.op = '\x18';
      local_40._arg0 = (uchar)SVar1;
      local_40._arg1 = 1;
LAB_001104bc:
      local_40._arg2 = '\0';
      local_40._arg3 = '\0';
      SQFuncState::AddInstruction(pSVar3,&local_40);
    }
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PushLocalVariable(this->_fs,&local_38);
    if (this->_token != 0x2c) {
      return;
    }
    SVar1 = SQLexer::Lex(this_00);
    this->_token = SVar1;
  } while( true );
}

Assistant:

void LocalDeclStatement()
    {
        SQObject varname;
        Lex();
        if( _token == TK_FUNCTION) {
            Lex();
            varname = Expect(TK_IDENTIFIER);
            Expect(_SC('('));
            CreateFunction(varname,false);
            _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            return;
        }

        do {
            varname = Expect(TK_IDENTIFIER);
            if(_token == _SC('=')) {
                Lex(); Expression();
                SQInteger src = _fs->PopTarget();
                SQInteger dest = _fs->PushTarget();
                if(dest != src) _fs->AddInstruction(_OP_MOVE, dest, src);
            }
            else{
                _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            }
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            if(_token == _SC(',')) Lex(); else break;
        } while(1);
    }